

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O1

void __thiscall helics::TranslatorFederate::~TranslatorFederate(TranslatorFederate *this)

{
  function<void_(const_helics::ActionMessage_&)> *pfVar1;
  _Manager_type *pp_Var2;
  function<void_(helics::ActionMessage_&&)> *pfVar3;
  _Manager_type *pp_Var4;
  function<void_(const_helics::ActionMessage_&)> *pfVar5;
  _Manager_type *pp_Var6;
  function<void_(helics::ActionMessage_&&)> *pfVar7;
  _Manager_type *pp_Var8;
  function<void_(helics::ActionMessage_&)> *pfVar9;
  _Manager_type *pp_Var10;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *pfVar11;
  _Manager_type *pp_Var12;
  function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)> *pfVar13
  ;
  conditional_t<is_easily_hashable<GlobalHandle>::value,_std::unordered_map<GlobalHandle,_size_t>,_std::map<GlobalHandle,_size_t>_>
  *this_00;
  _Manager_type p_Var14;
  pointer ppVar15;
  pointer pGVar16;
  pointer pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  pfVar1 = &this->mQueueMessage;
  pp_Var2 = &(this->mQueueMessage).super__Function_base._M_manager;
  p_Var14 = (this->mQueueMessage).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    *pp_Var2 = (_Manager_type)0x0;
    (this->mQueueMessage)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar3 = &this->mQueueMessageMove;
  pp_Var4 = &(this->mQueueMessageMove).super__Function_base._M_manager;
  p_Var14 = (this->mQueueMessageMove).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
    *pp_Var4 = (_Manager_type)0x0;
    (this->mQueueMessageMove)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar5 = &this->mSendMessage;
  pp_Var6 = &(this->mSendMessage).super__Function_base._M_manager;
  p_Var14 = (this->mSendMessage).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar5,(_Any_data *)pfVar5,__destroy_functor);
    *pp_Var6 = (_Manager_type)0x0;
    (this->mSendMessage)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar7 = &this->mSendMessageMove;
  pp_Var8 = &(this->mSendMessageMove).super__Function_base._M_manager;
  p_Var14 = (this->mSendMessageMove).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar7,(_Any_data *)pfVar7,__destroy_functor);
    *pp_Var8 = (_Manager_type)0x0;
    (this->mSendMessageMove)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar9 = &this->mDeliverMessage;
  pp_Var10 = &(this->mDeliverMessage).super__Function_base._M_manager;
  p_Var14 = (this->mDeliverMessage).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar9,(_Any_data *)pfVar9,__destroy_functor);
    *pp_Var10 = (_Manager_type)0x0;
    (this->mDeliverMessage)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar11 = &this->mLogger;
  pp_Var12 = &(this->mLogger).super__Function_base._M_manager;
  p_Var14 = (this->mLogger).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar11,(_Any_data *)pfVar11,__destroy_functor);
    *pp_Var12 = (_Manager_type)0x0;
    (this->mLogger)._M_invoker = (_Invoker_type)0x0;
  }
  pfVar13 = &this->mGetAirLock;
  p_Var14 = (this->mGetAirLock).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar13,(_Any_data *)pfVar13,__destroy_functor);
    (this->mGetAirLock).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->mGetAirLock)._M_invoker = (_Invoker_type)0x0;
  }
  std::
  vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ::_M_erase_at_end(&(this->translators).dataStorage,
                    (this->translators).dataStorage.
                    super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this_00 = &(this->translators).lookup;
  std::
  _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  std::
  vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ::~vector(&(this->translators).dataStorage);
  p_Var14 = (this->mGetAirLock).super__Function_base._M_manager;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar13,(_Any_data *)pfVar13,__destroy_functor);
  }
  p_Var14 = *pp_Var12;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar11,(_Any_data *)pfVar11,__destroy_functor);
  }
  p_Var14 = *pp_Var10;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar9,(_Any_data *)pfVar9,__destroy_functor);
  }
  p_Var14 = *pp_Var8;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar7,(_Any_data *)pfVar7,__destroy_functor);
  }
  p_Var14 = *pp_Var6;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar5,(_Any_data *)pfVar5,__destroy_functor);
  }
  p_Var14 = *pp_Var4;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
  }
  p_Var14 = *pp_Var2;
  if (p_Var14 != (_Manager_type)0x0) {
    (*p_Var14)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  (this->mCoord).super_BaseTimeCoordinator._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__TimeCoordinator_004dd3e8;
  ppVar15 = (this->mCoord).timeBlocks.
            super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar15 != (pointer)0x0) {
    operator_delete(ppVar15,(long)(this->mCoord).timeBlocks.
                                  super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar15
                   );
  }
  pGVar16 = (this->mCoord).dependency_federates.m_obj.
            super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pGVar16 != (pointer)0x0) {
    operator_delete(pGVar16,(long)(this->mCoord).dependency_federates.m_obj.
                                  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar16
                   );
  }
  pGVar16 = (this->mCoord).dependent_federates.m_obj.
            super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pGVar16 != (pointer)0x0) {
    operator_delete(pGVar16,(long)(this->mCoord).dependent_federates.m_obj.
                                  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar16
                   );
  }
  BaseTimeCoordinator::~BaseTimeCoordinator(&(this->mCoord).super_BaseTimeCoordinator);
  pcVar17 = (this->mName)._M_dataplus._M_p;
  paVar18 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar17 != paVar18) {
    operator_delete(pcVar17,paVar18->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TranslatorFederate::~TranslatorFederate()
{
    mHandles = nullptr;
    current_state = FederateStates::CREATED;

    mQueueMessage = nullptr;
    mQueueMessageMove = nullptr;
    mSendMessage = nullptr;
    mSendMessageMove = nullptr;
    mDeliverMessage = nullptr;

    mLogger = nullptr;
    mGetAirLock = nullptr;

    translators.clear();
}